

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_ref.cpp
# Opt level: O2

ON_SubDComponentRef * __thiscall
ON_SubDComponentRefList::Append
          (ON_SubDComponentRefList *this,ON_SubDRef *subd_ref,ON_SubDComponentPtr component_ptr,
          ON_SubDComponentLocation component_location,ON__UINT_PTR reference_id)

{
  bool bVar1;
  ON_SubD *this_00;
  ON_SubDComponentRef *pOVar2;
  ON_SubDComponentRef r;
  ON_SubDComponentPtr local_70;
  ON_SubDComponentRef local_68;
  
  this_00 = (subd_ref->m_subd_sp).super___shared_ptr<ON_SubD,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00 == (element_type *)0x0) {
    this_00 = &ON_SubD::Empty;
  }
  local_70.m_ptr = component_ptr.m_ptr;
  bVar1 = ON_SubD::IsEmpty(this_00);
  pOVar2 = &ON_SubDComponentRef::Empty;
  if (!bVar1) {
    bVar1 = ON_SubDComponentPtr::IsNull(&local_70);
    if (bVar1) {
      ON_SubDComponentRef::Create(&local_68,subd_ref,local_70,component_location,reference_id);
      pOVar2 = Append(this,&local_68);
      ON_SubDComponentRef::~ON_SubDComponentRef(&local_68);
    }
  }
  return pOVar2;
}

Assistant:

const ON_SubDComponentRef& ON_SubDComponentRefList::Append(
  const ON_SubDRef & subd_ref, 
  ON_SubDComponentPtr component_ptr, 
  ON_SubDComponentLocation component_location,
  ON__UINT_PTR reference_id
)
{
  for (;;)
  {
    if (subd_ref.SubD().IsEmpty())
      break;
    if (false == component_ptr.IsNull())
      break;
    const ON_SubDComponentRef r(ON_SubDComponentRef::Create(subd_ref, component_ptr, component_location,reference_id));
    return Append(&r);
  }
  return ON_SubDComponentRef::Empty;
}